

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_pgen_chunk.cpp
# Opt level: O0

void __thiscall sf2cute::SFRIFFPgenChunk::SFRIFFPgenChunk(SFRIFFPgenChunk *this)

{
  SFRIFFPgenChunk *this_local;
  
  RIFFChunkInterface::RIFFChunkInterface(&this->super_RIFFChunkInterface);
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface =
       (_func_int **)&PTR__SFRIFFPgenChunk_00163bf8;
  this->size_ = 0;
  this->presets_ =
       (vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
        *)0x0;
  memset(&this->instrument_index_map_,0,0x38);
  std::
  unordered_map<const_sf2cute::SFInstrument_*,_unsigned_short,_std::hash<const_sf2cute::SFInstrument_*>,_std::equal_to<const_sf2cute::SFInstrument_*>,_std::allocator<std::pair<const_sf2cute::SFInstrument_*const,_unsigned_short>_>_>
  ::unordered_map(&this->instrument_index_map_);
  return;
}

Assistant:

SFRIFFPgenChunk::SFRIFFPgenChunk() :
    size_(0),
    presets_(nullptr),
    instrument_index_map_() {
}